

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVariablesShaft.h
# Opt level: O2

void __thiscall chrono::ChVariablesShaft::ArchiveOUT(ChVariablesShaft *this,ChArchiveOut *marchive)

{
  ChNameValue<double> local_28;
  
  ChArchiveOut::VersionWrite<chrono::ChVariablesShaft>(marchive);
  local_28._value = &this->m_inertia;
  local_28._name = "m_inertia";
  local_28._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_28);
  return;
}

Assistant:

virtual void ArchiveOUT(ChArchiveOut& marchive) override {
        // version number
        marchive.VersionWrite<ChVariablesShaft>();
        // serialize parent class
        ChVariables::ArchiveOUT(marchive);
        // serialize all member data:
        marchive << CHNVP(m_inertia);
    }